

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

BlockInfo * __thiscall
Wasm::WasmBytecodeGenerator::PushLabel
          (WasmBytecodeGenerator *this,WasmBlock blockData,ByteCodeLabel label,
          bool addBlockYieldInfo,bool checkInParams)

{
  ArenaAllocator *alloc;
  PolymorphicEmitInfo *this_00;
  IWasmByteCodeWriter *pIVar1;
  ArgSlot AVar2;
  OpCodeAsmJs OVar3;
  WasmType WVar4;
  EmitInfoBase EVar5;
  uint32 uVar6;
  Local LVar7;
  RegSlot RVar8;
  BlockInfo *this_01;
  WasmRegisterSpace *pWVar9;
  WasmSignature *this_02;
  undefined7 in_register_00000009;
  EmitInfo EVar10;
  EmitInfo EVar11;
  uint32 i_1;
  uint uVar12;
  uint32 i;
  uint32 index;
  uint count;
  BlockInfo *local_80;
  BlockInfo *blockInfo;
  PolymorphicEmitInfo inParams;
  EmitInfo param;
  WasmBlock blockData_local;
  
  alloc = &this->m_alloc;
  param = (EmitInfo)blockData;
  this_01 = (BlockInfo *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
  *(undefined8 *)&this_01->paramInfo = 0;
  (this_01->paramInfo).field_1.infos = (EmitInfo *)0x0;
  this_01->didYield = false;
  *(undefined3 *)&this_01->field_0x21 = 0;
  this_01->label = 0;
  *(undefined8 *)&this_01->yieldInfo = 0;
  (this_01->yieldInfo).field_1.infos = (EmitInfo *)0x0;
  this_01->label = label;
  local_80 = this_01;
  if ((int)CONCAT71(in_register_00000009,addBlockYieldInfo) != 0) {
    this_00 = &this_01->yieldInfo;
    if (((ulong)blockData & 1) == 0) {
      uVar6 = WasmBlock::GetSignatureId((WasmBlock *)&param);
      this_02 = Js::WebAssemblyModule::GetSignature(this->m_module,uVar6);
      AVar2 = WasmSignature::GetParamCount(this_02);
      count = (uint)AVar2;
      blockInfo._0_4_ = 0;
      inParams.count = 0;
      inParams._4_4_ = 0;
      if (AVar2 != 0 && checkInParams) {
        PolymorphicEmitInfo::Init((PolymorphicEmitInfo *)&blockInfo,count,alloc);
        uVar12 = count;
        while (0 < (int)uVar12) {
          uVar12 = uVar12 - 1;
          LVar7 = WasmSignature::GetParam(this_02,(ArgSlot)uVar12);
          inParams.field_1.singleInfo = PopEvalStack(this,LVar7,(char16 *)0x0);
          ReleaseLocation(this,&inParams.field_1.singleInfo);
          PolymorphicEmitInfo::SetInfo
                    ((PolymorphicEmitInfo *)&blockInfo,inParams.field_1.singleInfo,uVar12 & 0xffff);
        }
      }
      uVar6 = this_02->m_resultsCount;
      if (uVar6 != 0) {
        PolymorphicEmitInfo::Init(this_00,uVar6,alloc);
        for (index = 0; uVar6 != index; index = index + 1) {
          LVar7 = WasmSignature::GetResult(this_02,index);
          pWVar9 = GetRegisterSpace(this,LVar7);
          EVar5.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar9);
          EVar11.type = LVar7;
          EVar11.super_EmitInfoBase.location = EVar5.location;
          PolymorphicEmitInfo::SetInfo(this_00,EVar11,index);
        }
      }
      if (AVar2 != 0 && checkInParams) {
        PolymorphicEmitInfo::Init((PolymorphicEmitInfo *)this_01,count,alloc);
        for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
          EVar11 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)&blockInfo,uVar6);
          pWVar9 = GetRegisterSpace(this,EVar11.type);
          RVar8 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar9);
          PolymorphicEmitInfo::SetInfo
                    ((PolymorphicEmitInfo *)this_01,
                     (EmitInfo)((ulong)RVar8 | (ulong)EVar11 & 0xffffffff00000000),uVar6);
        }
        while (0 < (int)count) {
          count = count - 1;
          EVar11 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)&blockInfo,count & 0xffff);
          EVar10 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)this_01,count & 0xffff);
          pIVar1 = this->m_writer;
          OVar3 = GetLoadOp(this,EVar10.type);
          (*pIVar1->_vptr_IWasmByteCodeWriter[0xf])
                    (pIVar1,(ulong)OVar3,(ulong)EVar10 & 0xffffffff,(ulong)EVar11 & 0xffffffff);
        }
      }
    }
    else {
      WVar4 = WasmBlock::GetSingleResult((WasmBlock *)&param);
      if (WVar4 != Void) {
        WVar4 = WasmBlock::GetSingleResult((WasmBlock *)&param);
        pWVar9 = GetRegisterSpace(this,WVar4);
        EVar5.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar9);
        WVar4 = WasmBlock::GetSingleResult((WasmBlock *)&param);
        EVar10.type = WVar4;
        EVar10.super_EmitInfoBase.location = EVar5.location;
        PolymorphicEmitInfo::Init(this_00,EVar10);
      }
    }
  }
  JsUtil::
  List<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
            (&(this->m_blockInfos).list,&local_80);
  return local_80;
}

Assistant:

BlockInfo* WasmBytecodeGenerator::PushLabel(WasmBlock blockData, Js::ByteCodeLabel label, bool addBlockYieldInfo, bool checkInParams)
{
    BlockInfo* blockInfo = Anew(&m_alloc, BlockInfo);
    blockInfo->label = label;
    if (addBlockYieldInfo)
    {
        if (blockData.IsSingleResult())
        {
            if (blockData.GetSingleResult() != WasmTypes::Void)
            {
                blockInfo->yieldInfo.Init(EmitInfo(GetRegisterSpace(blockData.GetSingleResult())->AcquireTmpRegister(), blockData.GetSingleResult()));
            }
        }
        else
        {
            uint32 sigId = blockData.GetSignatureId();
            WasmSignature* signature = m_module->GetSignature(sigId);

            Js::ArgSlot paramCount = signature->GetParamCount();
            checkInParams = checkInParams && paramCount > 0;
            PolymorphicEmitInfo inParams;
            if (checkInParams)
            {
                inParams.Init(paramCount, &m_alloc);
                // Pop the params in reverse order
                for (int i = paramCount - 1; i >= 0; --i)
                {
                    Js::ArgSlot iArg = (Js::ArgSlot)i;
                    EmitInfo param = PopEvalStack(signature->GetParam(iArg));
                    ReleaseLocation(&param);
                    inParams.SetInfo(param, iArg);
                }
            }

            uint32 resultCount = signature->GetResultCount();
            if (resultCount > 0)
            {
                blockInfo->yieldInfo.Init(resultCount, &m_alloc);
                for (uint32 i = 0; i < resultCount; ++i)
                {
                    WasmTypes::WasmType type = signature->GetResult(i);
                    blockInfo->yieldInfo.SetInfo(EmitInfo(GetRegisterSpace(type)->AcquireTmpRegister(), type), i);
                }
            }

            if (checkInParams)
            {
                blockInfo->paramInfo.Init(paramCount, &m_alloc);
                // Acquire tmp registers in order
                for (uint32 i = 0; i < paramCount; ++i)
                {
                    EmitInfo info = inParams.GetInfo(i);
                    EmitInfo newInfo = info;
                    newInfo.location = GetRegisterSpace(info.type)->AcquireTmpRegister();
                    blockInfo->paramInfo.SetInfo(newInfo, i);
                }
                // Todo:: Instead of moving inparams to new location,
                // Treat inparams as local and bypass ReleaseLocation until we exit the scope

                // Move in params to new location in reverse order
                for (int i = paramCount - 1; i >= 0; --i)
                {
                    Js::ArgSlot iArg = (Js::ArgSlot)i;
                    EmitInfo info = inParams.GetInfo(iArg);
                    EmitInfo newInfo = blockInfo->paramInfo.GetInfo(iArg);
                    m_writer->AsmReg2(GetLoadOp(newInfo.type), newInfo.location, info.location);
                }
            }
        }
    }
    m_blockInfos.Push(blockInfo);
    return blockInfo;
}